

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v_basic.c
# Opt level: O0

_Bool mptest_el_access2(int nrow,int ncol,m256v *Ml,m2v *Ms)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  m2v *in_RCX;
  int in_ESI;
  int in_EDI;
  int c;
  int r;
  int N;
  int niter;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  int c_00;
  int r_00;
  
  r_00 = 1000;
  c_00 = 0;
  while( true ) {
    if (999 < c_00) {
      return true;
    }
    iVar2 = rand();
    iVar2 = iVar2 % in_EDI;
    iVar3 = rand();
    bVar1 = m256v_get_el((m256v *)CONCAT44(iVar2,iVar3 % in_ESI),in_stack_ffffffffffffffcc,
                         in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffcc = (uint)bVar1;
    uVar4 = m2v_get_el(in_RCX,r_00,c_00);
    if (in_stack_ffffffffffffffcc != uVar4) break;
    c_00 = c_00 + 1;
  }
  return false;
}

Assistant:

static bool mptest_el_access2(int nrow, int ncol, m256v* Ml, m2v* Ms)
{
	const int niter = 1000;
	for (int N = 0; N < niter; ++N) {
		const int r = rand() % nrow;
		const int c = rand() % ncol;
		if (m256v_get_el(Ml, r, c) != m2v_get_el(Ms, r, c))
			return false;
	}
	return true;
}